

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O2

Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
GuiScope::writeExport
          (Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GuiScope *this,string_view config,UniformsMap *uniforms)

{
  allocator<char> local_59;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Not implemented",&local_59);
  local_38 = local_28;
  if (local_58 == local_48) {
    uStack_20 = uStack_40;
  }
  else {
    local_38 = local_58;
  }
  local_30 = local_50;
  local_50 = 0;
  local_48[0] = 0;
  local_58 = local_48;
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Expected<IAutomation::ExportResult, std::string> GuiScope::writeExport(std::string_view config, const shader::UniformsMap &uniforms) const {
	return Unexpected(std::string("Not implemented"));
}